

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O2

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::OpenForInsert
          (GeneratorResponseContext *this,string *filename,string *insertion_point)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *this_00;
  StringOutputStream *this_01;
  string *target;
  Arena *pAVar1;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                      (&(this->response_->field_0)._impl_.file_.super_RepeatedPtrFieldBase);
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 1;
  pAVar1 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(this_00->field_0)._impl_.name_,filename,pAVar1);
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 2;
  pAVar1 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(this_00->field_0)._impl_.insertion_point_,insertion_point,pAVar1);
  this_01 = (StringOutputStream *)operator_new(0x10);
  target = CodeGeneratorResponse_File::_internal_mutable_content_abi_cxx11_(this_00);
  io::StringOutputStream::StringOutputStream(this_01,target);
  return &this_01->super_ZeroCopyOutputStream;
}

Assistant:

io::ZeroCopyOutputStream* OpenForInsert(
      const std::string& filename,
      const std::string& insertion_point) override {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    file->set_insertion_point(insertion_point);
    return new io::StringOutputStream(file->mutable_content());
  }